

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachOpenEach(sqlite3_vtab *p,sqlite3_vtab_cursor **ppCursor)

{
  void *pvVar1;
  undefined8 *in_RSI;
  sqlite3 *in_RDI;
  JsonEachCursor *pCur;
  JsonEachConnection *pVtab;
  int local_4;
  
  pvVar1 = sqlite3DbMallocZero(in_RDI,0xaaaaaaaaaaaaaaaa);
  if (pvVar1 == (void *)0x0) {
    local_4 = 7;
  }
  else {
    *(sqlite3_mutex **)((long)pvVar1 + 0x30) = in_RDI->mutex;
    jsonStringZero((JsonString *)((long)pvVar1 + 0x38));
    *in_RSI = pvVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int jsonEachOpenEach(sqlite3_vtab *p, sqlite3_vtab_cursor **ppCursor){
  JsonEachConnection *pVtab = (JsonEachConnection*)p;
  JsonEachCursor *pCur;

  UNUSED_PARAMETER(p);
  pCur = sqlite3DbMallocZero(pVtab->db, sizeof(*pCur));
  if( pCur==0 ) return SQLITE_NOMEM;
  pCur->db = pVtab->db;
  jsonStringZero(&pCur->path);
  *ppCursor = &pCur->base;
  return SQLITE_OK;
}